

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# type.pb.cc
# Opt level: O1

Option * google::protobuf::Arena::CreateMaybeMessage<google::protobuf::Option>(Arena *arena)

{
  Option *this;
  
  if (arena == (Arena *)0x0) {
    this = (Option *)operator_new(0x28);
    (this->super_Message).super_MessageLite._internal_metadata_.ptr_ = (void *)0x0;
    (this->super_Message).super_MessageLite._vptr_MessageLite = (_func_int **)&PTR__Option_003c8998;
    (this->_cached_size_).size_.super___atomic_base<int>._M_i = 0;
    if (scc_info_Option_google_2fprotobuf_2ftype_2eproto.base.visit_status.super___atomic_base<int>.
        _M_i != 0) {
      internal::InitSCCImpl(&scc_info_Option_google_2fprotobuf_2ftype_2eproto.base);
    }
    (this->name_).ptr_ = (string *)&internal::fixed_address_empty_string_abi_cxx11_;
    this->value_ = (Any *)0x0;
  }
  else {
    if (arena->hooks_cookie_ != (void *)0x0) {
      OnArenaAllocation(arena,(type_info *)&Option::typeinfo,0x28);
    }
    this = (Option *)AllocateAlignedNoHook(arena,0x28);
    Option::Option(this,arena);
  }
  return this;
}

Assistant:

PROTOBUF_NOINLINE PROTOBUF_NAMESPACE_ID::Option* Arena::CreateMaybeMessage< PROTOBUF_NAMESPACE_ID::Option >(Arena* arena) {
  return Arena::CreateMessageInternal< PROTOBUF_NAMESPACE_ID::Option >(arena);
}